

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_env_infrastructure_reuse.hpp
# Opt level: O0

void __thiscall
so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::process
          (actual_elapsed_timers_collector_t *this)

{
  bool bVar1;
  reference msg_type;
  size_type sVar2;
  undefined1 local_b8 [8];
  demands_container_t demands;
  demand_t *d;
  iterator __end3;
  iterator __begin3;
  demands_container_t *__range3;
  actual_elapsed_timers_collector_t *this_local;
  
  std::
  deque<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ::begin((iterator *)&__end3._M_node,&this->m_demands);
  std::
  deque<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ::end((iterator *)&d,&this->m_demands);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&__end3._M_node,(_Self *)&d);
    if (!bVar1) break;
    msg_type = std::
               _Deque_iterator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t_&,_so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t_*>
               ::operator*((_Deque_iterator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t_&,_so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t_*>
                            *)&__end3._M_node);
    rt::impl::mbox_iface_for_timers_t::mbox_iface_for_timers_t
              ((mbox_iface_for_timers_t *)
               &demands.
                super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node,&msg_type->m_mbox);
    rt::impl::mbox_iface_for_timers_t::deliver_message_from_timer
              ((mbox_iface_for_timers_t *)
               &demands.
                super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node,&msg_type->m_type_index,
               &msg_type->m_message);
    std::
    _Deque_iterator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t_&,_so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t_*>
    ::operator++((_Deque_iterator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t_&,_so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t_*>
                  *)&__end3._M_node);
  }
  sVar2 = std::
          deque<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
          ::size(&this->m_demands);
  if (sVar2 < 1000) {
    std::
    deque<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
    ::clear(&this->m_demands);
  }
  else {
    std::
    deque<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
    ::deque((deque<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
             *)local_b8);
    std::
    deque<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
    ::swap((deque<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
            *)local_b8,&this->m_demands);
    std::
    deque<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
    ::~deque((deque<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
              *)local_b8);
  }
  return;
}

Assistant:

void
		process()
			{
				for( auto & d : m_demands )
				{
					so_5::rt::impl::mbox_iface_for_timers_t{ d.m_mbox }
							.deliver_message_from_timer( d.m_type_index, d.m_message );
				}

				// A defense from cases where were too many timers.
				if( m_demands.size() < 1000 )
					// A simple clean is enough.
					m_demands.clear();
				else
					{
						// Old container must be utilized.
						demands_container_t demands;
						demands.swap( m_demands );
					}
			}